

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

void __thiscall
stackjit::ByteCodeParser::parseFunctionBody
          (ByteCodeParser *this,Assembly *assembly,Function *currentFunction)

{
  bool bVar1;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *this_00;
  runtime_error *this_01;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  nextToken_abi_cxx11_(&local_50,this);
  std::__cxx11::string::~string((string *)&local_50);
  currentToken_abi_cxx11_(&local_b0,this);
  bVar1 = std::operator!=(&local_b0,"{");
  std::__cxx11::string::~string((string *)&local_b0);
  if (!bVar1) {
    nextToken_abi_cxx11_(&local_70,this);
    std::__cxx11::string::~string((string *)&local_70);
    this->mLocalsSet = false;
    while( true ) {
      currentToken_abi_cxx11_(&local_b0,this);
      bVar1 = std::operator==(&local_b0,"}");
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar1) break;
      parseInstruction(this,currentFunction);
      nextToken_abi_cxx11_(&local_90,this);
      std::__cxx11::string::~string((string *)&local_90);
    }
    this_00 = Loader::Assembly::functions(assembly);
    std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::push_back
              (this_00,currentFunction);
    nextTokenAtEnd(this);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Expected \'{\' after function definition.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ByteCodeParser::parseFunctionBody(Loader::Assembly& assembly, Loader::Function& currentFunction) {
		nextToken();
		if (currentToken() != "{") {
			throw std::runtime_error("Expected '{' after function definition.");
		}
		nextToken();

		mLocalsSet = false;
		while (true) {
			if (currentToken() == "}") {
				assembly.functions().push_back(currentFunction);
				nextTokenAtEnd();
				break;
			} else {
				parseInstruction(currentFunction);
			}

			nextToken();
		}
	}